

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.h
# Opt level: O0

Status * __thiscall draco::PointCloudEncoder::EncodeGeometryData(PointCloudEncoder *this)

{
  Status *in_RDI;
  
  OkStatus();
  return in_RDI;
}

Assistant:

virtual Status EncodeGeometryData() { return OkStatus(); }